

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadraticLikeCost.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::QuadraticLikeCost::costEvaluation
          (QuadraticLikeCost *this,double time,VectorDynSize *state,VectorDynSize *control,
          double *costValue)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  element_type *peVar3;
  undefined4 extraout_var_02;
  long lVar4;
  long lVar5;
  element_type *peVar6;
  undefined4 extraout_var_03;
  dense_product_base<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0,_6>
  *this_00;
  dense_product_base<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0,_6>
  *pdVar7;
  element_type *peVar8;
  undefined4 extraout_var_04;
  ostream *poVar9;
  char *pcVar10;
  double *in_RCX;
  long in_RDI;
  double in_XMM0_Qa;
  CoeffReturnType CVar11;
  Scalar SVar12;
  ostringstream errorMsg_11;
  double controlBias;
  ostringstream errorMsg_10;
  ostringstream errorMsg_9;
  VectorDynSize *gradient_1;
  ostringstream errorMsg_8;
  ostringstream errorMsg_7;
  ostringstream errorMsg_6;
  MatrixDynSize *hessian_1;
  ostringstream errorMsg_5;
  double stateBias;
  ostringstream errorMsg_4;
  ostringstream errorMsg_3;
  VectorDynSize *gradient;
  ostringstream errorMsg_2;
  ostringstream errorMsg_1;
  ostringstream errorMsg;
  MatrixDynSize *hessian;
  bool isValid;
  double controlCost;
  double stateCost;
  Index in_stack_ffffffffffffe828;
  DenseCoeffsBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>,_0>
  *in_stack_ffffffffffffe830;
  DenseBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffe838;
  ostringstream *this_01;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffe840;
  MatrixBase<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_ffffffffffffe848;
  MatrixDynSize *in_stack_ffffffffffffe858;
  dense_product_base<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0,_6>
  *in_stack_ffffffffffffe860;
  string local_1678 [32];
  ostringstream local_1658 [376];
  double local_14e0;
  string local_1460 [32];
  ostringstream local_1440 [376];
  string local_12c8 [32];
  ostringstream local_12a8 [376];
  undefined8 local_1130;
  string local_1038 [32];
  ostringstream local_1018 [376];
  string local_ea0 [32];
  ostringstream local_e80 [376];
  string local_d08 [32];
  ostringstream local_ce8 [376];
  undefined8 local_b70;
  string local_b68 [32];
  ostringstream local_b48 [376];
  double local_9d0;
  string local_950 [32];
  ostringstream local_930 [376];
  string local_7b8 [32];
  ostringstream local_798 [376];
  undefined8 local_620;
  string local_528 [32];
  ostringstream local_508 [376];
  string local_390 [32];
  ostringstream local_370 [376];
  string local_1f8 [48];
  ostringstream local_1c8 [376];
  undefined8 local_50;
  byte local_41;
  double local_40;
  double local_38;
  double *local_30;
  double local_18;
  byte local_1;
  
  local_38 = 0.0;
  local_40 = 0.0;
  local_41 = 0;
  local_30 = in_RCX;
  local_18 = in_XMM0_Qa;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x28));
  if (bVar1) {
    peVar3 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x33d173);
    iVar2 = (*peVar3->_vptr_TimeVaryingObject[2])(local_18,peVar3,&local_41);
    local_50 = CONCAT44(extraout_var,iVar2);
    if ((local_41 & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream(local_1c8);
      poVar9 = std::operator<<((ostream *)local_1c8,
                               "Unable to retrieve a valid state hessian at time: ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_18);
      std::operator<<(poVar9,".");
      std::__cxx11::ostringstream::str();
      pcVar10 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",pcVar10);
      std::__cxx11::string::~string(local_1f8);
      local_1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_1c8);
      goto LAB_0033e453;
    }
    lVar4 = iDynTree::MatrixDynSize::rows();
    lVar5 = iDynTree::MatrixDynSize::cols();
    if (lVar4 != lVar5) {
      std::__cxx11::ostringstream::ostringstream(local_370);
      poVar9 = std::operator<<((ostream *)local_370,"The state hessian at time: ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_18);
      std::operator<<(poVar9," is not squared.");
      std::__cxx11::ostringstream::str();
      pcVar10 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",pcVar10);
      std::__cxx11::string::~string(local_390);
      local_1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_370);
      goto LAB_0033e453;
    }
    lVar4 = iDynTree::MatrixDynSize::rows();
    lVar5 = iDynTree::VectorDynSize::size();
    if (lVar4 != lVar5) {
      std::__cxx11::ostringstream::ostringstream(local_508);
      poVar9 = std::operator<<((ostream *)local_508,"The hessian at time: ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_18);
      std::operator<<(poVar9," does not match the state dimension.");
      std::__cxx11::ostringstream::str();
      pcVar10 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",pcVar10);
      std::__cxx11::string::~string(local_528);
      local_1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_508);
      goto LAB_0033e453;
    }
    toEigen((VectorDynSize *)in_stack_ffffffffffffe848);
    Eigen::
    DenseBase<Eigen::Map<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>::
    transpose(in_stack_ffffffffffffe838);
    toEigen(in_stack_ffffffffffffe858);
    Eigen::
    MatrixBase<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>>>
    ::operator*(in_stack_ffffffffffffe848,
                (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                 *)in_stack_ffffffffffffe840);
    toEigen((VectorDynSize *)in_stack_ffffffffffffe848);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>>,Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::Stride<0,0>>,0>>
    ::operator*((MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                 *)in_stack_ffffffffffffe848,in_stack_ffffffffffffe840);
    CVar11 = Eigen::
             DenseCoeffsBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Map<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>,_0>
             ::operator()(in_stack_ffffffffffffe830,in_stack_ffffffffffffe828);
    local_38 = CVar11 * 0.5 + local_38;
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x38));
  if (bVar1) {
    local_41 = 0;
    peVar6 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x33d642);
    iVar2 = (*peVar6->_vptr_TimeVaryingObject[2])(local_18,peVar6,&local_41);
    local_620 = CONCAT44(extraout_var_00,iVar2);
    if ((local_41 & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream(local_798);
      poVar9 = std::operator<<((ostream *)local_798,
                               "Unable to retrieve a valid state gradient at time: ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_18);
      std::operator<<(poVar9,".");
      std::__cxx11::ostringstream::str();
      pcVar10 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",pcVar10);
      std::__cxx11::string::~string(local_7b8);
      local_1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_798);
      goto LAB_0033e453;
    }
    lVar4 = iDynTree::VectorDynSize::size();
    lVar5 = iDynTree::VectorDynSize::size();
    if (lVar4 != lVar5) {
      std::__cxx11::ostringstream::ostringstream(local_930);
      poVar9 = std::operator<<((ostream *)local_930,"The gradient at time: ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_18);
      std::operator<<(poVar9," have dimensions different from the state.");
      std::__cxx11::ostringstream::str();
      pcVar10 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",pcVar10);
      std::__cxx11::string::~string(local_950);
      local_1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_930);
      goto LAB_0033e453;
    }
    toEigen((VectorDynSize *)in_stack_ffffffffffffe848);
    Eigen::
    DenseBase<Eigen::Map<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>::
    transpose(in_stack_ffffffffffffe838);
    toEigen((VectorDynSize *)in_stack_ffffffffffffe848);
    Eigen::
    MatrixBase<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>>>
    ::operator*(in_stack_ffffffffffffe848,in_stack_ffffffffffffe840);
    SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double(in_stack_ffffffffffffe860)
    ;
    local_38 = SVar12 + local_38;
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x48));
  if (bVar1) {
    local_41 = 0;
    peVar8 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::TimeVaryingObject<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimeVaryingObject<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x33d980);
    iVar2 = (*peVar8->_vptr_TimeVaryingObject[2])(local_18,peVar8,&local_41);
    local_9d0 = *(double *)CONCAT44(extraout_var_01,iVar2);
    if ((local_41 & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream(local_b48);
      poVar9 = std::operator<<((ostream *)local_b48,
                               "Unable to retrieve a valid state cost bias at time: ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_18);
      std::operator<<(poVar9,".");
      std::__cxx11::ostringstream::str();
      pcVar10 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",pcVar10);
      std::__cxx11::string::~string(local_b68);
      local_1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_b48);
      goto LAB_0033e453;
    }
    local_38 = local_9d0 + local_38;
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x58));
  if (bVar1) {
    local_41 = 0;
    peVar3 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x33db18);
    iVar2 = (*peVar3->_vptr_TimeVaryingObject[2])(local_18,peVar3,&local_41);
    local_b70 = CONCAT44(extraout_var_02,iVar2);
    if ((local_41 & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream(local_ce8);
      poVar9 = std::operator<<((ostream *)local_ce8,
                               "Unable to retrieve a valid control hessian at time: ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_18);
      std::operator<<(poVar9,".");
      std::__cxx11::ostringstream::str();
      pcVar10 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",pcVar10);
      std::__cxx11::string::~string(local_d08);
      local_1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_ce8);
      goto LAB_0033e453;
    }
    lVar4 = iDynTree::MatrixDynSize::rows();
    lVar5 = iDynTree::MatrixDynSize::cols();
    if (lVar4 != lVar5) {
      std::__cxx11::ostringstream::ostringstream(local_e80);
      poVar9 = std::operator<<((ostream *)local_e80,"The control hessian at time: ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_18);
      std::operator<<(poVar9," is not squared.");
      std::__cxx11::ostringstream::str();
      pcVar10 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",pcVar10);
      std::__cxx11::string::~string(local_ea0);
      local_1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_e80);
      goto LAB_0033e453;
    }
    lVar4 = iDynTree::MatrixDynSize::rows();
    lVar5 = iDynTree::VectorDynSize::size();
    if (lVar4 != lVar5) {
      std::__cxx11::ostringstream::ostringstream(local_1018);
      poVar9 = std::operator<<((ostream *)local_1018,"The hessian at time: ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_18);
      std::operator<<(poVar9," does not match the control dimension.");
      std::__cxx11::ostringstream::str();
      pcVar10 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",pcVar10);
      std::__cxx11::string::~string(local_1038);
      local_1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_1018);
      goto LAB_0033e453;
    }
    toEigen((VectorDynSize *)in_stack_ffffffffffffe848);
    Eigen::
    DenseBase<Eigen::Map<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>::
    transpose(in_stack_ffffffffffffe838);
    toEigen(in_stack_ffffffffffffe858);
    Eigen::
    MatrixBase<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>>>
    ::operator*(in_stack_ffffffffffffe848,
                (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                 *)in_stack_ffffffffffffe840);
    toEigen((VectorDynSize *)in_stack_ffffffffffffe848);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>>,Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::Stride<0,0>>,0>>
    ::operator*((MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                 *)in_stack_ffffffffffffe848,in_stack_ffffffffffffe840);
    CVar11 = Eigen::
             DenseCoeffsBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Map<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>,_0>
             ::operator()(in_stack_ffffffffffffe830,in_stack_ffffffffffffe828);
    local_40 = CVar11 * 0.5 + local_40;
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x68));
  if (bVar1) {
    local_41 = 0;
    peVar6 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x33dfc9);
    iVar2 = (*peVar6->_vptr_TimeVaryingObject[2])(local_18,peVar6,&local_41);
    local_1130 = CONCAT44(extraout_var_03,iVar2);
    if ((local_41 & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream(local_12a8);
      poVar9 = std::operator<<((ostream *)local_12a8,
                               "Unable to retrieve a valid control gradient at time: ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_18);
      std::operator<<(poVar9,".");
      std::__cxx11::ostringstream::str();
      pcVar10 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",pcVar10);
      std::__cxx11::string::~string(local_12c8);
      local_1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_12a8);
      goto LAB_0033e453;
    }
    this_00 = (dense_product_base<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0,_6>
               *)iDynTree::VectorDynSize::size();
    pdVar7 = (dense_product_base<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0,_6>
              *)iDynTree::VectorDynSize::size();
    if (this_00 != pdVar7) {
      std::__cxx11::ostringstream::ostringstream(local_1440);
      poVar9 = std::operator<<((ostream *)local_1440,"The control hessian at time ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_18);
      std::operator<<(poVar9," have dimension different from the control dimension.");
      std::__cxx11::ostringstream::str();
      pcVar10 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",pcVar10);
      std::__cxx11::string::~string(local_1460);
      local_1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_1440);
      goto LAB_0033e453;
    }
    toEigen((VectorDynSize *)in_stack_ffffffffffffe848);
    Eigen::
    DenseBase<Eigen::Map<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>::
    transpose(in_stack_ffffffffffffe838);
    toEigen((VectorDynSize *)in_stack_ffffffffffffe848);
    Eigen::
    MatrixBase<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>>>
    ::operator*(in_stack_ffffffffffffe848,in_stack_ffffffffffffe840);
    SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double(this_00);
    local_40 = SVar12 + local_40;
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x78));
  if (bVar1) {
    local_41 = 0;
    peVar8 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::TimeVaryingObject<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimeVaryingObject<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x33e2dd);
    iVar2 = (*peVar8->_vptr_TimeVaryingObject[2])(local_18,peVar8,&local_41);
    local_14e0 = *(double *)CONCAT44(extraout_var_04,iVar2);
    if ((local_41 & 1) == 0) {
      this_01 = local_1658;
      std::__cxx11::ostringstream::ostringstream(this_01);
      poVar9 = std::operator<<((ostream *)this_01,
                               "Unable to retrieve a valid control cost bias at time: ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_18);
      std::operator<<(poVar9,".");
      std::__cxx11::ostringstream::str();
      pcVar10 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",pcVar10);
      std::__cxx11::string::~string(local_1678);
      local_1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_1658);
      goto LAB_0033e453;
    }
    local_40 = local_14e0 + local_40;
  }
  *local_30 = local_38 + local_40;
  local_1 = 1;
LAB_0033e453:
  return (bool)(local_1 & 1);
}

Assistant:

bool QuadraticLikeCost::costEvaluation(double time,
                                           const iDynTree::VectorDynSize& state,
                                           const iDynTree::VectorDynSize& control,
                                           double& costValue)
        {
            double stateCost = 0, controlCost = 0;

            bool isValid = false;
            if (m_timeVaryingStateHessian) {
                const MatrixDynSize &hessian = m_timeVaryingStateHessian->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid state hessian at time: " << time << ".";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                if (hessian.rows() != hessian.cols()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The state hessian at time: " << time << " is not squared.";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                if (hessian.rows() != state.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The hessian at time: " << time << " does not match the state dimension.";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }
                stateCost += 0.5 * (toEigen(state).transpose() * toEigen(hessian) * toEigen(state))(0);
            }

            if (m_timeVaryingStateGradient) {

                isValid = false;
                const VectorDynSize &gradient = m_timeVaryingStateGradient->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid state gradient at time: " << time << ".";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                if (state.size() != gradient.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The gradient at time: " << time << " have dimensions different from the state.";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }
                stateCost += toEigen(gradient).transpose()*toEigen(state);
            }

            if (m_timeVaryingStateCostBias) {

                isValid = false;
                double stateBias = m_timeVaryingStateCostBias->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid state cost bias at time: " << time << ".";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                stateCost += stateBias;
            }

            if (m_timeVaryingControlHessian) {

                isValid = false;
                const MatrixDynSize &hessian = m_timeVaryingControlHessian->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid control hessian at time: " << time << ".";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                if (hessian.rows() != hessian.cols()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The control hessian at time: " << time << " is not squared.";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                if (hessian.rows() != control.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The hessian at time: " << time << " does not match the control dimension.";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                controlCost += 0.5 * (toEigen(control).transpose() * toEigen(hessian) * toEigen(control))(0);
            }

            if (m_timeVaryingControlGradient) {

                isValid = false;
                const VectorDynSize &gradient = m_timeVaryingControlGradient->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid control gradient at time: " << time << ".";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                if (control.size() != gradient.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The control hessian at time " << time << " have dimension different from the control dimension.";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }
                controlCost += toEigen(gradient).transpose()*toEigen(control);
            }

            if (m_timeVaryingControlCostBias) {

                isValid = false;
                double controlBias = m_timeVaryingControlCostBias->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid control cost bias at time: " << time << ".";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                controlCost += controlBias;
            }

            costValue = stateCost + controlCost;
            return true;
        }